

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

void __thiscall
QAccessibleTableCell::QAccessibleTableCell
          (QAccessibleTableCell *this,QAbstractItemView *view_,QModelIndex *index_,Role role_)

{
  bool bVar1;
  QDebug *o;
  int in_ECX;
  QModelIndex *in_RDX;
  QMessageLogger *in_RSI;
  QAccessibleInterface *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa0;
  QAccessibleInterface *this_00;
  QDebug local_20;
  QDebug in_stack_ffffffffffffffe8;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QAccessibleInterface::QAccessibleInterface(in_RDI);
  QAccessibleTableCellInterface::QAccessibleTableCellInterface
            ((QAccessibleTableCellInterface *)(in_RDI + 8));
  QAccessibleActionInterface::QAccessibleActionInterface
            ((QAccessibleActionInterface *)(in_RDI + 0x10));
  *(undefined ***)in_RDI = &PTR__QAccessibleTableCell_00d2b3e0;
  *(undefined ***)(in_RDI + 8) = &PTR__QAccessibleTableCell_00d2b4f0;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QAccessibleTableCell_00d2b550;
  QPointer<QAbstractItemView>::QPointer<void>
            ((QPointer<QAbstractItemView> *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
             (QAbstractItemView *)in_RDI);
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(in_RDI + 0x28),in_RDX);
  *(int *)(in_RDI + 0x30) = in_ECX;
  bVar1 = QModelIndex::isValid((QModelIndex *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    QMessageLogger::QMessageLogger(in_RSI,(char *)in_RDX,in_ECX,(char *)in_RDI);
    QMessageLogger::warning();
    o = QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffe8.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffe8,o);
    ::operator<<((QDebug *)&local_10,(QModelIndex *)&stack0xffffffffffffffe8);
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe8);
    QDebug::~QDebug(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QAccessibleTableCell::QAccessibleTableCell(QAbstractItemView *view_, const QModelIndex &index_, QAccessible::Role role_)
    : /* QAccessibleSimpleEditableTextInterface(this), */ view(view_), m_index(index_), m_role(role_)
{
    if (Q_UNLIKELY(!index_.isValid()))
        qWarning() << "QAccessibleTableCell::QAccessibleTableCell with invalid index: " << index_;
}